

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-strtok.c
# Opt level: O2

int run_test_strtok(void)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  char *pcVar5;
  char *pcVar6;
  undefined8 uVar7;
  int64_t eval_b;
  int64_t eval_a;
  char *itr;
  char current_test [2048];
  
  lVar4 = 0;
  eval_a = 0;
  do {
    if (lVar4 == 4) {
      return 0;
    }
    eval_b = 0x12;
    if (0x11 < eval_a) {
      pcVar6 = "<";
      pcVar3 = "tokens_len";
      pcVar5 = "j";
      uVar7 = 0x4d;
      goto LAB_0017c436;
    }
    pcVar5 = (char *)(&DAT_00201cd8)[lVar4 * 2];
    snprintf(current_test,0x800,"%s",(&PTR_anon_var_dwarf_995dd_00201cd0)[lVar4 * 2]);
    pcVar3 = uv__strtok(current_test,pcVar5,&itr);
    pcVar6 = tokens[eval_a];
    bVar1 = pcVar6 == (char *)0x0 || pcVar3 != (char *)0x0;
    if ((pcVar3 == (char *)0x0) || (pcVar6 == (char *)0x0)) {
LAB_0017c300:
      bVar1 = (bool)(pcVar3 == (char *)0x0 & bVar1);
    }
    else {
      iVar2 = strcmp(pcVar3,pcVar6);
      bVar1 = true;
      if (iVar2 != 0) {
        bVar1 = false;
        goto LAB_0017c300;
      }
    }
    eval_b = 0;
    if (!bVar1) {
      pcVar6 = "!=";
      pcVar3 = "0";
      pcVar5 = 
      "(tok_r != ((void*)0) && tokens[j] != ((void*)0) && strcmp(tok_r, tokens[j]) == 0) || (tok_r == tokens[j] && tok_r == ((void*)0))"
      ;
      uVar7 = 0x50;
      eval_a = 0;
LAB_0017c436:
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-strtok.c"
              ,uVar7,pcVar5,pcVar6,pcVar3,eval_a,pcVar6,eval_b);
      abort();
    }
    while (eval_a = eval_a + 1, pcVar3 != (char *)0x0) {
      eval_b = 0x12;
      if (0x11 < eval_a) {
        pcVar6 = "<";
        pcVar3 = "tokens_len";
        pcVar5 = "j";
        uVar7 = 0x53;
        goto LAB_0017c436;
      }
      pcVar3 = uv__strtok((char *)0x0,pcVar5,&itr);
      pcVar6 = tokens[eval_a];
      bVar1 = pcVar6 == (char *)0x0 || pcVar3 != (char *)0x0;
      if ((pcVar3 == (char *)0x0) || (pcVar6 == (char *)0x0)) {
LAB_0017c38c:
        bVar1 = (bool)(pcVar3 == (char *)0x0 & bVar1);
      }
      else {
        iVar2 = strcmp(pcVar3,pcVar6);
        bVar1 = true;
        if (iVar2 != 0) {
          bVar1 = false;
          goto LAB_0017c38c;
        }
      }
      eval_b = 0;
      if (!bVar1) {
        pcVar6 = "!=";
        pcVar3 = "0";
        pcVar5 = 
        "(tok_r != ((void*)0) && tokens[j] != ((void*)0) && strcmp(tok_r, tokens[j]) == 0) || (tok_r == tokens[j] && tok_r == ((void*)0))"
        ;
        uVar7 = 0x55;
        eval_a = 0;
        goto LAB_0017c436;
      }
    }
    lVar4 = lVar4 + 1;
  } while( true );
}

Assistant:

TEST_IMPL(strtok) {
  struct strtok_test_case tests[] = {
    { "abc", "" },
    { "abc.abf", "." },
    { "This;is.a:test:of=the/string\\tokenizer-function.", "\\/:;=-" },
    { "Hello This-is-a-nice.-string", " ." },
  };
  size_t tokens_len = ARRAY_SIZE(tokens);
  size_t tests_len = ARRAY_SIZE(tests);
  size_t i;
  size_t j;
  char* itr;
  char* tok_r;
  char current_test[2048];

  for (i = 0, j = 0; i < tests_len; i += 1) {
    ASSERT_LT(j, tokens_len);
    snprintf(current_test, sizeof(current_test), "%s", tests[i].str);
    tok_r = uv__strtok(current_test, tests[i].sep, &itr);
    ASSERT_STRCMP(tok_r, tokens[j]);
    j++;
    while (tok_r) {
      ASSERT_LT(j, tokens_len);
      tok_r = uv__strtok(NULL, tests[i].sep, &itr);
      ASSERT_STRCMP(tok_r, tokens[j]);
      j++;
    }
  }
  return 0;
}